

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

QList<QGraphicsItem_*> * __thiscall
QGraphicsViewPrivate::findItems
          (QList<QGraphicsItem_*> *__return_storage_ptr__,QGraphicsViewPrivate *this,
          QRegion *exposedRegion,bool *allItems,QTransform *viewTransform)

{
  QGraphicsView *this_00;
  char cVar1;
  int iVar2;
  long lVar3;
  QRect *this_01;
  QRect *pQVar4;
  QRect *r;
  long in_FS_OFFSET;
  QPainterPath local_90 [8];
  QPainterPath exposedScenePath;
  QPointF *local_80;
  QRegion adjustedRegion;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsView **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  local_58.w._0_4_ = 0xffffffff;
  local_58.w._4_4_ = 0xffffffff;
  local_58.h._0_4_ = 0xffffffff;
  local_58.h._4_4_ = 0xffffffff;
  local_58.xp._0_4_ = 0xffffffff;
  local_58.xp._4_4_ = 0xffffffff;
  local_58.yp._0_4_ = 0xffffffff;
  local_58.yp._4_4_ = 0xffffffff;
  lVar3 = QRegion::boundingRect();
  adjustedRegion.d =
       (QRegionData *)
       (CONCAT44((int)((ulong)lVar3 >> 0x20),(int)(lVar3 + 0xffffffff)) + -0x100000000);
  QGraphicsView::mapToScene((QPolygonF *)&exposedScenePath,this_00,(QRect *)&adjustedRegion);
  QPolygonF::boundingRect();
  QArrayDataPointer<QPointF>::~QArrayDataPointer((QArrayDataPointer<QPointF> *)&exposedScenePath);
  QGraphicsScene::sceneRect((QRectF *)&exposedScenePath,(QGraphicsScene *)(this->scene).wp.value);
  cVar1 = QRectF::contains((QRectF *)&local_58);
  if (cVar1 == '\0') {
    iVar2 = QRegion::rectCount();
    if (iVar2 == 1) {
      iVar2 = QTransform::type();
      if (iVar2 < 3) {
        QGraphicsScene::items
                  (__return_storage_ptr__,(QGraphicsScene *)(this->scene).wp.value,&local_58,
                   IntersectsItemBoundingRect,AscendingOrder,viewTransform);
        goto LAB_005bbd94;
      }
    }
    adjustedRegion.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion(&adjustedRegion);
    this_01 = (QRect *)QRegion::begin();
    pQVar4 = (QRect *)QRegion::end();
    for (; this_01 != pQVar4; this_01 = this_01 + 1) {
      _exposedScenePath = QRect::adjusted(this_01,-1,-1,1,1);
      QRegion::operator+=(&adjustedRegion,(QRect *)&exposedScenePath);
    }
    _exposedScenePath = &DAT_aaaaaaaaaaaaaaaa;
    qt_regionToPath((QRegion *)local_90);
    QGraphicsView::mapToScene((QGraphicsView *)&exposedScenePath,(QPainterPath *)this_00);
    QPainterPath::~QPainterPath(local_90);
    QGraphicsScene::items
              (__return_storage_ptr__,(QGraphicsScene *)(this->scene).wp.value,&exposedScenePath,
               IntersectsItemBoundingRect,AscendingOrder,viewTransform);
    QPainterPath::~QPainterPath(&exposedScenePath);
    QRegion::~QRegion(&adjustedRegion);
  }
  else {
    *allItems = true;
    QGraphicsScene::items
              (__return_storage_ptr__,(QGraphicsScene *)(this->scene).wp.value,AscendingOrder);
  }
LAB_005bbd94:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QGraphicsItem *> QGraphicsViewPrivate::findItems(const QRegion &exposedRegion, bool *allItems,
                                                       const QTransform &viewTransform) const
{
    Q_Q(const QGraphicsView);

    // Step 1) If all items are contained within the expose region, then
    // return a list of all visible items. ### the scene's growing bounding
    // rect does not take into account untransformable items.
    const QRectF exposedRegionSceneBounds = q->mapToScene(exposedRegion.boundingRect().adjusted(-1, -1, 1, 1))
                                            .boundingRect();
    if (exposedRegionSceneBounds.contains(scene->sceneRect())) {
        Q_ASSERT(allItems);
        *allItems = true;

        // All items are guaranteed within the exposed region.
        return scene->items(Qt::AscendingOrder);
    }

    // Step 2) If the expose region is a simple rect and the view is only
    // translated or scaled, search for items using
    // QGraphicsScene::items(QRectF).
    bool simpleRectLookup =  exposedRegion.rectCount() == 1 && matrix.type() <= QTransform::TxScale;
    if (simpleRectLookup) {
        return scene->items(exposedRegionSceneBounds,
                            Qt::IntersectsItemBoundingRect,
                            Qt::AscendingOrder, viewTransform);
    }

    // If the region is complex or the view has a complex transform, adjust
    // the expose region, convert it to a path, and then search for items
    // using QGraphicsScene::items(QPainterPath);
    QRegion adjustedRegion;
    for (const QRect &r : exposedRegion)
        adjustedRegion += r.adjusted(-1, -1, 1, 1);

    const QPainterPath exposedScenePath(q->mapToScene(qt_regionToPath(adjustedRegion)));
    return scene->items(exposedScenePath, Qt::IntersectsItemBoundingRect,
                        Qt::AscendingOrder, viewTransform);
}